

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.h
# Opt level: O2

void __thiscall IGameController::CheckReadyStates(IGameController *this,int WithoutID)

{
  EGameState GameState;
  bool bVar1;
  
  if ((this->m_pConfig->m_SvPlayerReadyMode != 0) &&
     ((GameState = this->m_GameState, GameState == IGS_GAME_PAUSED || (GameState == IGS_WARMUP_USER)
      ))) {
    bVar1 = GetPlayersReadyState(this,WithoutID);
    if (bVar1) {
      SetGameState(this,GameState,0);
      return;
    }
  }
  return;
}

Assistant:

CConfig *Config() const { return m_pConfig; }